

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# owning_string_map.hpp
# Opt level: O1

pair<std::_Rb_tree_iterator<std::pair<const_duckdb::string_t,_unsigned_long>_>,_bool> __thiscall
duckdb::
OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
::insert(OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
         *this,value_type entry)

{
  undefined4 uVar1;
  data_ptr_t __dest;
  ulong size;
  undefined8 __src;
  pair<std::_Rb_tree_iterator<std::pair<const_duckdb::string_t,_unsigned_long>_>,_bool> pVar2;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  _Rb_tree<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_long>,std::_Select1st<std::pair<duckdb::string_t_const,unsigned_long>>,std::less<duckdb::string_t>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>
  *local_50;
  anon_union_16_2_67f50693_for_value local_48;
  unsigned_long local_38;
  
  uVar1 = entry.first.value.pointer.length;
  __src = entry.first.value.pointer.ptr;
  local_50 = (_Rb_tree<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_long>,std::_Select1st<std::pair<duckdb::string_t_const,unsigned_long>>,std::less<duckdb::string_t>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>
              *)&this->map;
  if ((uint)entry.first.value._0_4_ < 0xd) {
    pVar2 = ::std::
            _Rb_tree<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_long>,std::_Select1st<std::pair<duckdb::string_t_const,unsigned_long>>,std::less<duckdb::string_t>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>
            ::_M_insert_unique<std::pair<duckdb::string_t_const,unsigned_long>>(local_50,&entry);
  }
  else {
    local_48._0_8_ = entry.first.value._0_8_;
    local_48.pointer.ptr = entry.first.value.pointer.ptr;
    size = local_48._0_8_ & 0xffffffff;
    __dest = Allocator::AllocateData(this->allocator,size);
    if (size < 0xd) {
      __src = local_48.pointer.prefix;
    }
    switchD_012dd528::default(__dest,(void *)__src,size);
    if (size < 0xd) {
      local_58 = 0;
      local_60 = 0;
      uStack_5c = 0;
      if (uVar1 != 0) {
        switchD_012dd528::default(&local_60,(void *)__src,size);
      }
    }
    else {
      local_60 = *(undefined4 *)__dest;
      uStack_5c = SUB84(__dest,0);
      local_58 = (undefined4)((ulong)__dest >> 0x20);
    }
    local_48.pointer.ptr = (char *)CONCAT44(local_58,uStack_5c);
    local_48._0_8_ = CONCAT44(local_60,uVar1);
    local_38 = entry.second;
    pVar2 = ::std::
            _Rb_tree<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_long>,std::_Select1st<std::pair<duckdb::string_t_const,unsigned_long>>,std::less<duckdb::string_t>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>
            ::_M_emplace_unique<std::pair<duckdb::string_t,unsigned_long>>
                      (local_50,(pair<duckdb::string_t,_unsigned_long> *)&local_48.pointer);
  }
  return pVar2;
}

Assistant:

pair<iterator, bool> insert(value_type entry) { // NOLINT: match std style
		if (entry.first.IsInlined()) {
			return map.insert(std::move(entry));
		} else {
			return map.insert(make_pair(CopyString(entry.first), std::move(entry.second)));
		}
	}